

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O0

VIterator __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::vfind
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  const_iterator puVar1;
  VIterator E;
  VIterator I;
  uint *V_local;
  SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this_local;
  
  E = SmallVectorTemplateCommon<unsigned_int,_void>::begin
                ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
  puVar1 = SmallVectorTemplateCommon<unsigned_int,_void>::end
                     ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
  while( true ) {
    if (E == puVar1) {
      puVar1 = SmallVectorTemplateCommon<unsigned_int,_void>::end
                         ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
      return puVar1;
    }
    if (*E == *V) break;
    E = E + 1;
  }
  return E;
}

Assistant:

VIterator vfind(const T &V) const {
    for (VIterator I = Vector.begin(), E = Vector.end(); I != E; ++I)
      if (*I == V)
        return I;
    return Vector.end();
  }